

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

Bool prvTidyAttributeIsProprietary(Node *node,AttVal *attval)

{
  uint uVar1;
  AttVal *attval_local;
  Node *node_local;
  
  if ((node == (Node *)0x0) || (attval == (AttVal *)0x0)) {
    node_local._4_4_ = no;
  }
  else if (node->tag == (Dict *)0x0) {
    node_local._4_4_ = no;
  }
  else if ((node->tag->versions & 0x61fff) == 0) {
    node_local._4_4_ = no;
  }
  else {
    uVar1 = AttributeVersions(node,attval);
    if ((uVar1 & 0x61fff) == 0) {
      node_local._4_4_ = yes;
    }
    else {
      node_local._4_4_ = no;
    }
  }
  return node_local._4_4_;
}

Assistant:

Bool TY_(AttributeIsProprietary)(Node* node, AttVal* attval)
{
    if (!node || !attval)
        return no;

    if (!node->tag)
        return no;

    if (!(node->tag->versions & VERS_ALL))
        return no;

    if (AttributeVersions(node, attval) & VERS_ALL)
        return no;

    return yes;
}